

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

VkExtent3D
vkt::synchronization::anon_unknown_0::get2DImageExtentWithSize
          (VkDeviceSize sizeBytes,deUint32 pixelSize)

{
  uint *puVar1;
  VkExtent3D VVar2;
  uint local_2c;
  uint local_28;
  deUint32 local_24;
  deUint32 size;
  deUint32 pixelSize_local;
  VkDeviceSize sizeBytes_local;
  
  local_28 = (uint)(sizeBytes / pixelSize);
  local_2c = 0x1000;
  local_24 = pixelSize;
  _size = sizeBytes;
  puVar1 = std::min<unsigned_int>(&local_28,&local_2c);
  VVar2 = ::vk::makeExtent3D(*puVar1,((local_28 >> 0xc) + 1) - (uint)((local_28 & 0xfff) == 0),1);
  return VVar2;
}

Assistant:

VkExtent3D get2DImageExtentWithSize (const VkDeviceSize sizeBytes, const deUint32 pixelSize)
{
	const deUint32 size = static_cast<deUint32>(sizeBytes / pixelSize);

	DE_ASSERT(size <= MAX_IMAGE_DIMENSION_2D * MAX_IMAGE_DIMENSION_2D);

	return makeExtent3D(
		std::min(size, static_cast<deUint32>(MAX_IMAGE_DIMENSION_2D)),
		(size / MAX_IMAGE_DIMENSION_2D) + (size % MAX_IMAGE_DIMENSION_2D != 0 ? 1u : 0u),
		1u);
}